

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.h
# Opt level: O1

void __thiscall
r_exec::HLPController::_store_evidence<r_exec::HLPController::EEntry>
          (HLPController *this,Cache<r_exec::HLPController::EEntry> *cache,_Fact *evidence)

{
  list<r_exec::HLPController::EEntry> *this_00;
  pointer pcVar1;
  long lVar2;
  long c;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  int64_t next;
  EEntry e;
  EEntry local_50;
  
  EEntry::EEntry(&local_50,evidence);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)cache);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  uVar5 = (*Now)();
  this_00 = &cache->evidences;
  lVar2 = (cache->evidences).used_cells_head;
  while (c = lVar2, c != -1) {
    pcVar1 = (this_00->cells).
             super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar3 = (**(code **)(**(long **)&pcVar1[c].data.evidence + 0x70))();
    lVar2 = (this_00->cells).
            super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
            ._M_impl.super__Vector_impl_data._M_start[c].next;
    if ((bVar3 | pcVar1[c].data.before < uVar5) == 1) {
      r_code::list<r_exec::HLPController::EEntry>::__erase(this_00,c);
    }
  }
  r_code::list<r_exec::HLPController::EEntry>::push_front(this_00,&local_50);
  pthread_mutex_unlock((pthread_mutex_t *)cache);
  if (local_50.evidence.object != (_Object *)0x0) {
    LOCK();
    ((local_50.evidence.object)->refCount).super___atomic_base<long>._M_i =
         ((local_50.evidence.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_50.evidence.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_50.evidence.object)->_vptr__Object[1])();
    }
  }
  return;
}

Assistant:

void _store_evidence(Cache<E> *cache, _Fact *evidence)
    {
        E e(evidence);
        std::lock_guard<std::mutex> guard(cache->mutex);
        uint64_t now = r_exec::Now();
        typename r_code::list<E>::const_iterator _e;

        for (_e = cache->evidences.begin(); _e != cache->evidences.end();) {
            if ((*_e).is_too_old(now)) { // garbage collection.
                _e = cache->evidences.erase(_e);
            } else {
                ++_e;
            }
        }

        cache->evidences.push_front(e);
    }